

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O0

void __thiscall S2Polyline::Shape::Init(Shape *this,S2Polyline *polyline)

{
  int iVar1;
  ostream *poVar2;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  S2Polyline *local_18;
  S2Polyline *polyline_local;
  Shape *this_local;
  
  local_18 = polyline;
  polyline_local = (S2Polyline *)this;
  iVar1 = S2Polyline::num_vertices(polyline);
  if (iVar1 == 1) {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.cc"
               ,0x279,kWarning,(ostream *)&std::cerr);
    poVar2 = S2LogMessage::stream(&local_30);
    poVar2 = std::operator<<(poVar2,"S2Polyline::Shape with one vertex has no edges");
    S2LogMessageVoidify::operator&(&local_19,poVar2);
    S2LogMessage::~S2LogMessage(&local_30);
  }
  this->polyline_ = local_18;
  return;
}

Assistant:

void S2Polyline::Shape::Init(const S2Polyline* polyline) {
  S2_LOG_IF(WARNING, polyline->num_vertices() == 1)
      << "S2Polyline::Shape with one vertex has no edges";
  polyline_ = polyline;
}